

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3ExprLHitGather(Fts3Expr *pExpr,MatchInfo *p)

{
  char cVar1;
  int iVar2;
  sqlite3_vtab *psVar3;
  Fts3Phrase *pFVar4;
  int iVar5;
  int iVar6;
  u32 uVar7;
  uint uVar8;
  ulong uVar9;
  char *p_00;
  int local_3c;
  char *local_38;
  
  while( true ) {
    if (pExpr->bEof != '\0') {
      return 0;
    }
    if (pExpr->iDocid != p->pCursor->iPrevId) break;
    if (pExpr->pLeft == (Fts3Expr *)0x0) {
      psVar3 = (p->pCursor->base).pVtab;
      pFVar4 = pExpr->pPhrase;
      local_38 = (pFVar4->doclist).pList;
      local_3c = 0;
      cVar1 = p->flag;
      iVar6 = p->nCol;
      if (cVar1 != 'y') {
        iVar6 = (iVar6 + 0x1f) / 0x20;
      }
      iVar6 = iVar6 * pExpr->iPhrase;
      do {
        iVar5 = local_3c;
        uVar7 = fts3ColumnlistCount(&local_38);
        iVar2 = pFVar4->iColumn;
        if ((iVar2 == iVar5) || (*(int *)&psVar3[2].pModule <= iVar2)) {
          if (cVar1 == 'y') {
            p->aMatchinfo[iVar5 + iVar6] = uVar7;
          }
          else if (uVar7 != 0) {
            p->aMatchinfo[(iVar5 + 1) / 0x20 + iVar6] =
                 p->aMatchinfo[(iVar5 + 1) / 0x20 + iVar6] | 1 << ((byte)iVar5 & 0x1f);
          }
        }
        if (*local_38 != '\x01') {
          return 0;
        }
        p_00 = local_38 + 1;
        if (local_38[1] < '\0') {
          uVar8 = sqlite3Fts3GetVarint32(p_00,&local_3c);
          uVar9 = (ulong)uVar8;
        }
        else {
          uVar9 = 1;
          local_3c = (int)local_38[1];
        }
        local_38 = p_00 + uVar9;
      } while (local_3c < p->nCol);
      return 0x10b;
    }
    iVar6 = fts3ExprLHitGather(pExpr->pLeft,p);
    if (iVar6 != 0) {
      return iVar6;
    }
    pExpr = pExpr->pRight;
  }
  return 0;
}

Assistant:

static int fts3ExprLHitGather(
  Fts3Expr *pExpr,
  MatchInfo *p
){
  int rc = SQLITE_OK;
  assert( (pExpr->pLeft==0)==(pExpr->pRight==0) );
  if( pExpr->bEof==0 && pExpr->iDocid==p->pCursor->iPrevId ){
    if( pExpr->pLeft ){
      rc = fts3ExprLHitGather(pExpr->pLeft, p);
      if( rc==SQLITE_OK ) rc = fts3ExprLHitGather(pExpr->pRight, p);
    }else{
      rc = fts3ExprLHits(pExpr, p);
    }
  }
  return rc;
}